

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_ossl_hash.h
# Opt level: O2

void __thiscall CryptHash::InitHash(CryptHash *this,int type)

{
  pointer puVar1;
  int iVar2;
  runtime_error *this_00;
  pointer puVar3;
  
  if (6 < (uint)type) {
    __assert_fail("type>=0 && type<(int)NRHASHTYPES",
                  "/workspace/llm4binary/github/license_c_cmakelists/nlitsme[P]hexdumper/dump_ossl_hash.h"
                  ,0xba,"void CryptHash::InitHash(int)");
  }
  this->m_type = type;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_state,(long)hashdefs[(uint)type].statesize);
  puVar1 = (this->m_state).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar3 = (pointer)0x0;
  if (puVar1 != (this->m_state).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    puVar3 = puVar1;
  }
  iVar2 = (*hashdefs[this->m_type].init)(puVar3);
  if (iVar2 != 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"hash-init");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void InitHash(int type)
    {
        assert(type>=0 && type<(int)NRHASHTYPES);

        m_type= type;
        m_state.resize(hashdefs[m_type].statesize);
        if (!hashdefs[m_type].init(vectorptr(m_state)))
            throw std::runtime_error("hash-init");
    }